

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push.c
# Opt level: O2

void push0_pipe_close(void *arg)

{
  nni_lmq *lmq;
  _Bool _Var1;
  int iVar2;
  
  lmq = *(nni_lmq **)((long)arg + 8);
  nni_aio_close((nni_aio *)((long)arg + 0x20));
  nni_aio_close((nni_aio *)((long)arg + 0x1e8));
  nni_mtx_lock((nni_mtx *)(lmq[1].lmq_buf + 1));
  iVar2 = nni_list_node_active((nni_list_node *)((long)arg + 0x10));
  if (iVar2 != 0) {
    nni_list_node_remove((nni_list_node *)((long)arg + 0x10));
    iVar2 = nni_list_empty((nni_list *)&lmq[1].lmq_len);
    if (iVar2 != 0) {
      _Var1 = nni_lmq_full(lmq);
      if (_Var1) {
        nni_pollable_clear((nni_pollable *)&lmq[1].lmq_msgs);
      }
    }
  }
  nni_mtx_unlock((nni_mtx *)(lmq[1].lmq_buf + 1));
  return;
}

Assistant:

static void
push0_pipe_close(void *arg)
{
	push0_pipe *p = arg;
	push0_sock *s = p->push;

	nni_aio_close(&p->aio_recv);
	nni_aio_close(&p->aio_send);

	nni_mtx_lock(&s->m);
	if (nni_list_node_active(&p->node)) {
		nni_list_node_remove(&p->node);

		if (nni_list_empty(&s->pl) && nni_lmq_full(&s->wq)) {
			nni_pollable_clear(&s->writable);
		}
	}
	nni_mtx_unlock(&s->m);
}